

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_video.cpp
# Opt level: O1

void __thiscall DCanvas::~DCanvas(DCanvas *this)

{
  uint uVar1;
  PClass *this_00;
  DObject **ppDVar2;
  DCanvas *pDVar3;
  DCanvas *pDVar4;
  DCanvas **ppDVar5;
  
  (this->super_DObject)._vptr_DObject = (_func_int **)&PTR_StaticType_007032d0;
  if (CanvasChain != (DCanvas *)0x0) {
    pDVar4 = CanvasChain;
    if (CanvasChain == this) {
      ppDVar5 = &CanvasChain;
    }
    else {
      do {
        pDVar3 = pDVar4;
        pDVar4 = pDVar3->Next;
        if (pDVar4 == (DCanvas *)0x0) goto code_r0x00375dca;
      } while (pDVar4 != this);
      ppDVar5 = &pDVar3->Next;
    }
    *ppDVar5 = pDVar4->Next;
    DObject::~DObject(&this->super_DObject);
    return;
  }
code_r0x00375dca:
  (this->super_DObject)._vptr_DObject = (_func_int **)&PTR_StaticType_006f6d50;
  if (PClass::bShutdown == false) {
    if ((this->super_DObject).Class == (PClass *)0x0) {
      (this->super_DObject).Class = DObject::RegistrationInfo.MyClass;
    }
    this_00 = (this->super_DObject).Class;
    uVar1 = (this->super_DObject).ObjectFlags;
    if ((uVar1 & 0x40) == 0) {
      if (-1 < (char)uVar1) {
        Printf("Warning: \'%s\' is freed outside the GC process.\n");
      }
      DObject::StaticPointerSubstitution(&this->super_DObject,(DObject *)0x0,false);
      ppDVar2 = (DObject **)&GC::Root;
      if (GC::Root != (DCanvas *)0x0) {
        pDVar4 = GC::Root;
        if (GC::Root != this) {
          do {
            pDVar3 = pDVar4;
            pDVar4 = (DCanvas *)(pDVar3->super_DObject).ObjNext;
            if (pDVar4 == (DCanvas *)0x0) goto LAB_00375e95;
          } while (pDVar4 != this);
          ppDVar2 = &(pDVar3->super_DObject).ObjNext;
        }
        *ppDVar2 = (this->super_DObject).ObjNext;
        if (&(this->super_DObject).ObjNext == GC::SweepPos) {
          GC::SweepPos = ppDVar2;
        }
      }
LAB_00375e95:
      ppDVar2 = (DObject **)&GC::Gray;
      if (GC::Gray != (DCanvas *)0x0 && ((this->super_DObject).ObjectFlags & 7) == 0) {
        pDVar4 = GC::Gray;
        if (GC::Gray != this) {
          do {
            pDVar3 = pDVar4;
            pDVar4 = (DCanvas *)(pDVar3->super_DObject).GCNext;
            if (pDVar4 == (DCanvas *)0x0) goto LAB_00375ed3;
          } while (pDVar4 != this);
          ppDVar2 = &(pDVar3->super_DObject).GCNext;
        }
        *ppDVar2 = (this->super_DObject).GCNext;
      }
    }
LAB_00375ed3:
    if (this_00 != (PClass *)0x0) {
      PClass::DestroySpecials(this_00,this);
    }
  }
  return;
}

Assistant:

DCanvas::~DCanvas ()
{
	// Remove from list of active canvases
	DCanvas *probe = CanvasChain, **prev;

	prev = &CanvasChain;
	probe = CanvasChain;

	while (probe != NULL)
	{
		if (probe == this)
		{
			*prev = probe->Next;
			break;
		}
		prev = &probe->Next;
		probe = probe->Next;
	}
}